

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  long *plVar2;
  int val2;
  int val1;
  int local_30;
  int local_2c;
  
  local_2c = 10;
  local_30 = 0x14;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"before swap: val1=",0x12);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", val2=",7);
  plVar2 = (long *)std::ostream::operator<<(poVar1,local_30);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  swap(&local_2c,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"after swap: val1=",0x11)
  ;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", val2=",7);
  plVar2 = (long *)std::ostream::operator<<(poVar1,local_30);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int val1 = 10;
    int val2 = 20;
    cout << "before swap: val1=" << val1 << ", val2=" << val2 << endl;
    swap(val1, val2);
    cout << "after swap: val1=" << val1 << ", val2=" << val2 << endl;
    return 0;
}